

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O2

void __thiscall
chrono::ChSpringShape::UpdateLineGeometry
          (ChSpringShape *this,ChVector<double> *endpoint1,ChVector<double> *endpoint2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  int iu;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  double dVar9;
  double dVar10;
  double __x;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  shared_ptr<chrono::geometry::ChLinePath> linepath;
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  ChVector<double> V2;
  ChVector<double> V1;
  undefined1 local_168 [16];
  double local_158;
  __shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2> local_150;
  ChVector<double> local_140;
  undefined1 local_128 [24];
  double dStack_110;
  double local_f8;
  double dStack_f0;
  ChVector<double> v;
  ChVector<double> dir;
  undefined1 local_b0 [32];
  double dStack_88;
  double local_80;
  undefined1 local_78 [64];
  double local_38;
  undefined1 auVar7 [64];
  
  std::make_shared<chrono::geometry::ChLinePath>();
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])endpoint2->m_data,*(undefined1 (*) [16])endpoint1->m_data);
  v.m_data[2] = endpoint2->m_data[2] - endpoint1->m_data[2];
  Vx.m_data[2] = 0.0;
  Vy.m_data[2] = 0.0;
  Vz.m_data[2] = 0.0;
  Vx.m_data[0] = 0.0;
  Vx.m_data[1] = 0.0;
  Vy.m_data[0] = 0.0;
  Vy.m_data[1] = 0.0;
  Vz.m_data[0] = 0.0;
  Vz.m_data[1] = 0.0;
  dVar9 = ChVector<double>::Length(&v);
  ChVector<double>::GetNormalized(&dir,&v);
  XdirToDxDyDz<double>(&dir,(ChVector<double> *)&VECT_Y,&Vx,&Vy,&Vz);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = Vx.m_data[2];
  auVar6 = vbroadcastsd_avx512f(auVar1);
  auVar6 = vpermi2pd_avx512f(_DAT_00f4ce00,
                             ZEXT2464(CONCAT816(auVar6._16_8_,CONCAT88(Vx.m_data[1],Vx.m_data[0]))),
                             ZEXT1664(CONCAT88(Vy.m_data[1],Vy.m_data[0])));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = Vy.m_data[2];
  auVar7 = vbroadcastsd_avx512f(auVar2);
  auVar8._0_40_ = auVar6._0_40_;
  auVar8._40_8_ = auVar7._40_8_;
  auVar8._48_8_ = auVar6._48_8_;
  auVar8._56_8_ = auVar6._56_8_;
  local_78 = vpermi2pd_avx512f(_DAT_00f4ce40,auVar8,ZEXT1664(CONCAT88(Vz.m_data[1],Vz.m_data[0])));
  local_38 = Vz.m_data[2];
  ChMatrix33<double>::Get_A_quaternion
            ((ChQuaternion<double> *)local_128,(ChMatrix33<double> *)local_78);
  dVar10 = endpoint1->m_data[2];
  auVar15._8_8_ = dVar10;
  auVar15._0_8_ = dVar10;
  auVar15._16_8_ = dVar10;
  auVar15._24_8_ = dVar10;
  auVar15 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])endpoint1->m_data),auVar15,0x30);
  auVar17._8_8_ = local_128._0_8_;
  auVar17._0_8_ = local_128._0_8_;
  auVar17._16_8_ = local_128._0_8_;
  auVar17._24_8_ = local_128._0_8_;
  local_b0 = vblendps_avx(auVar15,auVar17,0xc0);
  dStack_88 = (double)local_128._16_8_;
  local_80 = dStack_110;
  dVar10 = 0.0;
  dVar12 = 0.0;
  for (uVar5 = 1; uVar5 <= this->resolution; uVar5 = uVar5 + 1) {
    auVar4._8_8_ = in_XMM4_Qb;
    auVar4._0_8_ = in_XMM4_Qa;
    auVar1 = vcvtusi2sd_avx512f(auVar4,this->resolution);
    __x = (this->turns * 6.283185307179586 * (double)(int)uVar5) / auVar1._0_8_;
    dVar3 = ((double)(int)uVar5 / auVar1._0_8_) * dVar9;
    dVar13 = this->radius;
    dVar11 = cos(dVar12);
    dVar14 = this->radius;
    dVar12 = sin(dVar12);
    V1.m_data[2] = dVar12 * dVar14;
    dVar12 = this->radius;
    V1.m_data[0] = dVar10;
    V1.m_data[1] = dVar11 * dVar13;
    dVar13 = cos(__x);
    dVar10 = this->radius;
    dVar14 = sin(__x);
    V2.m_data[2] = dVar14 * dVar10;
    V2.m_data[0] = dVar3;
    V2.m_data[1] = dVar13 * dVar12;
    ChCoordsys<double>::TransformLocalToParent
              ((ChVector<double> *)local_168,(ChCoordsys<double> *)local_b0,&V1);
    ChCoordsys<double>::TransformLocalToParent(&local_140,(ChCoordsys<double> *)local_b0,&V2);
    auVar16._8_8_ = local_158;
    auVar16._0_8_ = local_158;
    auVar16._16_8_ = local_158;
    auVar16._24_8_ = local_158;
    local_128._8_4_ = local_128._8_4_ & 0xffffff00;
    local_128._12_4_ = 2;
    local_128._0_8_ = &PTR__ChGeometry_01189830;
    auVar15 = vblendps_avx(ZEXT1632(local_168),auVar16,0x30);
    auVar18._8_8_ = local_140.m_data[0];
    auVar18._0_8_ = local_140.m_data[0];
    auVar18._16_8_ = local_140.m_data[0];
    auVar18._24_8_ = local_140.m_data[0];
    unique0x000ebc80 = vblendps_avx(auVar15,auVar18,0xc0);
    local_f8 = local_140.m_data[1];
    dStack_f0 = local_140.m_data[2];
    geometry::ChLinePath::AddSubLine
              (linepath.super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(ChLine *)local_128,1.0);
    dVar10 = dVar3;
    dVar12 = __x;
  }
  std::static_pointer_cast<chrono::geometry::ChLine,chrono::geometry::ChLinePath>
            ((shared_ptr<chrono::geometry::ChLinePath> *)&local_150);
  std::__shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChPointPointShape).super_ChLineShape.gline.
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>,&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&linepath.super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChSpringShape::UpdateLineGeometry(const ChVector<>& endpoint1, const ChVector<>& endpoint2) {
    auto linepath = chrono_types::make_shared<geometry::ChLinePath>();

    // Following part was copied from irrlicht::tools::drawSpring()
    ChVector<> dist = endpoint2 - endpoint1;
    ChVector<> Vx, Vy, Vz;
    double length = dist.Length();
    ChVector<> dir = dist.GetNormalized();
    XdirToDxDyDz(dir, VECT_Y, Vx, Vy, Vz);

    ChMatrix33<> rel_matrix(Vx, Vy, Vz);
    ChCoordsys<> mpos(endpoint1, rel_matrix.Get_A_quaternion());

    double phaseA = 0;
    double phaseB = 0;
    double heightA = 0;
    double heightB = 0;

    for (int iu = 1; iu <= resolution; iu++) {
        phaseB = turns * CH_C_2PI * (double)iu / (double)resolution;
        heightB = length * ((double)iu / (double)resolution);
        ChVector<> V1(heightA, radius * cos(phaseA), radius * sin(phaseA));
        ChVector<> V2(heightB, radius * cos(phaseB), radius * sin(phaseB));

        auto segment = geometry::ChLineSegment(mpos.TransformLocalToParent(V1), mpos.TransformLocalToParent(V2));
        linepath->AddSubLine(segment);
        phaseA = phaseB;
        heightA = heightB;
    }

    this->SetLineGeometry(std::static_pointer_cast<geometry::ChLine>(linepath));
}